

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t *
Acb_DerivePatchSupportS
          (Cnf_Dat_t *pCnf,int nCiTars,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  Vec_Int_t *p;
  int iVar1;
  Vec_Int_t *pVVar2;
  solver_t *s;
  satoko_opts_t *psVar3;
  abctime aVar4;
  abctime aVar5;
  char *pStr;
  long lVar6;
  ulong uVar7;
  abctime time;
  abctime time_00;
  abctime time_01;
  int iVar8;
  uint i;
  int *piVar9;
  int iVar10;
  uint uVar11;
  int local_80;
  int local_7c;
  int local_78;
  int Lit;
  solver_t *local_70;
  Vec_Int_t *local_68;
  uint local_5c;
  int local_58;
  int local_54;
  abctime local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pVVar2 = Vec_IntAlloc(100);
  iVar8 = pCnf->nVars - nCiTars;
  s = satoko_create();
  local_40 = (ulong)(uint)nCoDivs;
  satoko_setnvars(s,nCoDivs + nCiTars + pCnf->nVars * 2);
  psVar3 = satoko_options(s);
  psVar3->no_simplify = '\x01';
  lVar6 = 0;
  while (lVar6 < pCnf->nClauses) {
    piVar9 = pCnf->pClauses[lVar6];
    iVar1 = satoko_add_clause(s,piVar9,(int)((ulong)((long)pCnf->pClauses[lVar6 + 1] - (long)piVar9)
                                            >> 2));
    lVar6 = lVar6 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Lit = 2;
  iVar1 = satoko_add_clause(s,&Lit,1);
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pCnf->pMan = (Aig_Man_t *)0x0;
  Cnf_DataLift(pCnf,pCnf->nVars);
  lVar6 = 0;
  while (lVar6 < pCnf->nClauses) {
    piVar9 = pCnf->pClauses[lVar6];
    iVar1 = satoko_add_clause(s,piVar9,(int)((ulong)((long)pCnf->pClauses[lVar6 + 1] - (long)piVar9)
                                            >> 2));
    lVar6 = lVar6 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataLift(pCnf,-pCnf->nVars);
  Lit = Abc_Var2Lit(pCnf->nVars + 1,0);
  piVar9 = &Lit;
  iVar1 = satoko_add_clause(s,piVar9,1);
  iVar10 = (int)piVar9;
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  local_68 = pVVar2;
  if (0 < nCiTars) {
    Lit = Abc_Var2Lit(iVar8,1);
    iVar1 = satoko_add_clause(s,&Lit,1);
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
    Lit = Abc_Var2Lit(iVar8 + pCnf->nVars,0);
    piVar9 = &Lit;
    iVar8 = satoko_add_clause(s,piVar9,1);
    iVar10 = (int)piVar9;
    if (iVar8 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  pVVar2 = local_68;
  if (0 < (int)local_40) {
    local_50 = Abc_Clock();
    iVar8 = pCnf->nVars;
    pVVar2->nSize = 0;
    local_48 = (ulong)(uint)(nCiTars + iVar8 * 2);
    iVar8 = nCiTars * 2 + iVar8 * 4;
    uVar7 = 0;
    iVar1 = 4;
    local_70 = s;
    while( true ) {
      s = local_70;
      iVar10 = (int)uVar7;
      if ((int)local_40 == iVar10) break;
      local_5c = (int)local_48 + iVar10;
      iVar10 = iVar10 + pCnf->nVars;
      uVar11 = iVar10 + 2;
      local_38 = uVar7;
      if ((int)(uVar11 | local_5c) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x538,"int satoko_add_xor(satoko_t *, int, int, int, int)");
      }
      local_7c = iVar1 + 1;
      local_78 = iVar10 + 3 + uVar11;
      local_80 = iVar8 + 1;
      local_58 = local_78;
      local_54 = local_7c;
      iVar10 = satoko_add_clause(local_70,&local_80,3);
      if (iVar10 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x53e,"int satoko_add_xor(satoko_t *, int, int, int, int)");
      }
      local_80 = iVar8 + 1;
      local_7c = iVar1;
      local_78 = uVar11 * 2;
      iVar10 = satoko_add_clause(local_70,&local_80,3);
      if (iVar10 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x544,"int satoko_add_xor(satoko_t *, int, int, int, int)");
      }
      local_7c = local_54;
      local_80 = iVar8;
      local_78 = uVar11 * 2;
      iVar10 = satoko_add_clause(local_70,&local_80,3);
      pVVar2 = local_68;
      if (iVar10 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x54a,"int satoko_add_xor(satoko_t *, int, int, int, int)");
      }
      local_78 = local_58;
      local_80 = iVar8;
      local_7c = iVar1;
      iVar10 = satoko_add_clause(local_70,&local_80,3);
      if (iVar10 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                      ,0x550,"int satoko_add_xor(satoko_t *, int, int, int, int)");
      }
      iVar10 = Abc_Var2Lit(local_5c,1);
      Vec_IntPush(pVVar2,iVar10);
      uVar7 = (ulong)((int)local_38 + 1);
      iVar8 = iVar8 + 2;
      iVar1 = iVar1 + 2;
    }
    piVar9 = pVVar2->pArray;
    iVar8 = pVVar2->nSize;
    iVar1 = satoko_solve_assumptions(local_70,piVar9,iVar8);
    if (iVar1 != -1) {
      printf("Demonstrated that the problem has NO solution.  ");
      aVar4 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar4 - local_50),time);
      satoko_destroy(s);
      Vec_IntFree(pVVar2);
      return (Vec_Int_t *)0x0;
    }
    i = 0;
    printf("Proved that the problem has a solution.  ");
    aVar4 = Abc_Clock();
    Abc_PrintTime(0x816bba,(char *)(aVar4 - local_50),time_00);
    aVar4 = Abc_Clock();
    iVar8 = satoko_minimize_assumptions(s,piVar9,iVar8,0);
    Vec_IntShrink(pVVar2,iVar8);
    uVar11 = pVVar2->nSize;
    printf("Solved the problem with %d supp vars.  ",(ulong)uVar11);
    aVar5 = Abc_Clock();
    pStr = (char *)(aVar5 - aVar4);
    Abc_PrintTime(0x816bba,pStr,time_01);
    p = local_68;
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    for (; pVVar2 = local_68, iVar10 = (int)pStr, uVar11 != i; i = i + 1) {
      iVar8 = Vec_IntEntry(p,i);
      iVar8 = Abc_Lit2Var(iVar8);
      pStr = (char *)(ulong)i;
      Vec_IntWriteEntry(p,i,iVar8 - (int)local_48);
    }
    Vec_IntSort(local_68,iVar10);
  }
  satoko_destroy(s);
  Vec_IntSort(pVVar2,iVar10);
  return pVVar2;
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupportS( Cnf_Dat_t * pCnf, int nCiTars, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nCiTars;
    satoko_t * pSat = satoko_create();
    satoko_setnvars( pSat, 2 * pCnf->nVars + nCiTars + nCoDivs );
    satoko_options(pSat)->no_simplify = 1;
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !satoko_add_clause( pSat, &Lit, 1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !satoko_add_clause( pSat, &Lit, 1 ) )
        return NULL;
    // create XORs for targets
    if ( nCiTars > 0 )
    {
/*
        int iXorVar = 2 * pCnf->nVars;
        int Lit;
        Vec_IntClear( vSupp );
        for ( i = 0; i < nCiTars; i++ )
        {
            satoko_add_xor( pSat, iXorVar+i, iCiVarBeg+i, iCiVarBeg+i+pCnf->nVars, 0 );
            Vec_IntPush( vSupp, Abc_Var2Lit(iXorVar+i, 0) );
        }
        if ( !satoko_add_clause( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) ) )
            return NULL;
*/
        // add negative literal
        Lit = Abc_Var2Lit( iCiVarBeg, 1 );
        if ( !satoko_add_clause( pSat, &Lit, 1 ) )
            return NULL;
        // add positive literal
        Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars, 0 );
        if ( !satoko_add_clause( pSat, &Lit, 1 ) )
            return NULL;
    }
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, status, nSuppNew;
        int iDivVar = 2 * pCnf->nVars + nCiTars;
        Vec_IntClear( vSupp );
        for ( i = 0; i < nCoDivs; i++ )
        {
            satoko_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
            Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
/*                
            pLits[0] = Abc_Var2Lit(iCoVarBeg+1+i,             1);
            pLits[1] = Abc_Var2Lit(iCoVarBeg+1+i+pCnf->nVars, 0);
            pLits[2] = Abc_Var2Lit(iDivVar+i,                 1);
            if ( !satoko_add_clause( pSat, pLits, 3 ) )
                assert( 0 );

            pLits[0] = Abc_Var2Lit(iCoVarBeg+1+i,             0);
            pLits[1] = Abc_Var2Lit(iCoVarBeg+1+i+pCnf->nVars, 1);
            pLits[2] = Abc_Var2Lit(iDivVar+i,                 1);
            if ( !satoko_add_clause( pSat, pLits, 3 ) )
                assert( 0 );

            Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 0) );
*/
        }

        // try one run
        status = satoko_solve_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) );
        if ( status != l_False )
        {
            printf( "Demonstrated that the problem has NO solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            satoko_destroy( pSat );
            Vec_IntFree( vSupp );
            return NULL;
        }
        assert( status == l_False );
        printf( "Proved that the problem has a solution.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

        // find minimum subset
        if ( fUseMinAssump )
        {
            abctime clk = Abc_Clock();
            nSuppNew = satoko_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            printf( "Solved the problem with %d supp vars.  ", Vec_IntSize(vSupp) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        else
        {
            int * pFinal, nFinal = satoko_final_conflict( pSat, &pFinal );
            printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            Vec_IntClear( vSupp ); 
            for ( i = 0; i < nFinal; i++ )
                Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
            // try one run
            status = satoko_solve_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) );
            assert( status == l_False );
            // try again
            nFinal = satoko_final_conflict( pSat, &pFinal );
            printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
        }

        // remap them into numbers
        Vec_IntForEachEntry( vSupp, iLit, i )
            Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
        Vec_IntSort( vSupp, 0 );
        //Vec_IntPrint( vSupp );
    }
    satoko_destroy( pSat );
    Vec_IntSort( vSupp, 0 );
    return vSupp;
}